

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

void Cudd_Srandom(long seed)

{
  long lVar1;
  uint uVar2;
  
  cuddRand = seed + (ulong)(seed == 0);
  if (seed < 0) {
    cuddRand = -seed;
  }
  uVar2 = 0;
  cuddRand2 = cuddRand;
  do {
    lVar1 = (cuddRand / 0xd1a4) * -0x7fffffab + cuddRand * 0x9c4e;
    cuddRand = (ulong)((uint)(lVar1 >> 0x3f) & 0x7fffffab) + lVar1;
    shuffleTable[uVar2 & 0x3f] = cuddRand;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x4b);
  shuffleSelect = shuffleTable[1];
  return;
}

Assistant:

void
Cudd_Srandom(
  long  seed)
{
    int i;

    if (seed < 0)       cuddRand = -seed;
    else if (seed == 0) cuddRand = 1;
    else                cuddRand = seed;
    cuddRand2 = cuddRand;
    /* Load the shuffle table (after 11 warm-ups). */
    for (i = 0; i < STAB_SIZE + 11; i++) {
        long int w;
        w = cuddRand / LEQQ1;
        cuddRand = LEQA1 * (cuddRand - w * LEQQ1) - w * LEQR1;
        cuddRand += (cuddRand < 0) * MODULUS1;
        shuffleTable[i % STAB_SIZE] = cuddRand;
    }
    shuffleSelect = shuffleTable[1 % STAB_SIZE];

}